

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AlterRenameTable(Parse *pParse,SrcList *pSrc,Token *pName)

{
  sqlite3 *db_00;
  char *zDatabase;
  char *zIn;
  int iDb_00;
  int iVar1;
  Table *pTVar2;
  Table *pTVar3;
  Index *pIVar4;
  Vdbe *p;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 uVar6;
  undefined8 uVar5;
  VTable *pVStack_68;
  int i;
  VTable *pVTab;
  Vdbe *v;
  char *zTabName;
  int nTabName;
  sqlite3 *db;
  char *zName;
  Table *pTab;
  char *zDb;
  int iDb;
  Token *pName_local;
  SrcList *pSrc_local;
  Parse *pParse_local;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  db = (sqlite3 *)0x0;
  db_00 = pParse->db;
  pVStack_68 = (VTable *)0x0;
  if ((db_00->mallocFailed == '\0') &&
     (pTVar2 = sqlite3LocateTableItem(pParse,0,pSrc->a), pTVar2 != (Table *)0x0)) {
    iDb_00 = sqlite3SchemaToIndex(pParse->db,pTVar2->pSchema);
    zDatabase = db_00->aDb[iDb_00].zDbSName;
    db = (sqlite3 *)sqlite3NameFromToken(db_00,pName);
    if (db != (sqlite3 *)0x0) {
      pTVar3 = sqlite3FindTable(db_00,(char *)db,zDatabase);
      if (((pTVar3 == (Table *)0x0) &&
          (pIVar4 = sqlite3FindIndex(db_00,(char *)db,zDatabase), pIVar4 == (Index *)0x0)) &&
         (iVar1 = sqlite3IsShadowTableOf(db_00,pTVar2,(char *)db), iVar1 == 0)) {
        iVar1 = isAlterableTable(pParse,pTVar2);
        if ((iVar1 == 0) &&
           (iVar1 = sqlite3CheckObjectName(pParse,(char *)db,"table",(char *)db), iVar1 == 0)) {
          if (pTVar2->eTabType == '\x02') {
            sqlite3ErrorMsg(pParse,"view %s may not be altered",pTVar2->zName);
          }
          else {
            iVar1 = sqlite3AuthCheck(pParse,0x1a,zDatabase,pTVar2->zName,(char *)0x0);
            if ((iVar1 == 0) && (iVar1 = sqlite3ViewGetColumnNames(pParse,pTVar2), iVar1 == 0)) {
              if ((pTVar2->eTabType == '\x01') &&
                 (pVStack_68 = sqlite3GetVTable(db_00,pTVar2),
                 pVStack_68->pVtab->pModule->xRename == (_func_int_sqlite3_vtab_ptr_char_ptr *)0x0))
              {
                pVStack_68 = (VTable *)0x0;
              }
              p = sqlite3GetVdbe(pParse);
              if (p != (Vdbe *)0x0) {
                sqlite3MayAbort(pParse);
                zIn = pTVar2->zName;
                iVar1 = sqlite3Utf8CharLen(zIn,-1);
                uVar5 = CONCAT44(uVar6,(uint)(iDb_00 == 1));
                sqlite3NestedParse(pParse,
                                   "UPDATE \"%w\".sqlite_master SET sql = sqlite_rename_table(%Q, type, name, sql, %Q, %Q, %d) WHERE (type!=\'index\' OR tbl_name=%Q COLLATE nocase)AND   name NOT LIKE \'sqliteX_%%\' ESCAPE \'X\'"
                                   ,zDatabase,zDatabase,zIn,db,uVar5,zIn);
                sqlite3NestedParse(pParse,
                                   "UPDATE %Q.sqlite_master SET tbl_name = %Q, name = CASE WHEN type=\'table\' THEN %Q WHEN name LIKE \'sqliteX_autoindex%%\' ESCAPE \'X\'      AND type=\'index\' THEN \'sqlite_autoindex_\' || %Q || substr(name,%d+18) ELSE name END WHERE tbl_name=%Q COLLATE nocase AND (type=\'table\' OR type=\'index\' OR type=\'trigger\');"
                                   ,zDatabase,db,db,db,CONCAT44((int)((ulong)uVar5 >> 0x20),iVar1),
                                   zIn);
                pTVar2 = sqlite3FindTable(db_00,"sqlite_sequence",zDatabase);
                if (pTVar2 != (Table *)0x0) {
                  sqlite3NestedParse(pParse,
                                     "UPDATE \"%w\".sqlite_sequence set name = %Q WHERE name = %Q",
                                     zDatabase,db);
                }
                if (iDb_00 != 1) {
                  sqlite3NestedParse(pParse,
                                     "UPDATE sqlite_temp_schema SET sql = sqlite_rename_table(%Q, type, name, sql, %Q, %Q, 1), tbl_name = CASE WHEN tbl_name=%Q COLLATE nocase AND   sqlite_rename_test(%Q, sql, type, name, 1, \'after rename\', 0) THEN %Q ELSE tbl_name END WHERE type IN (\'view\', \'trigger\')"
                                     ,zDatabase,zIn,db,zIn,zDatabase,db);
                }
                if (pVStack_68 != (VTable *)0x0) {
                  iVar1 = pParse->nMem + 1;
                  pParse->nMem = iVar1;
                  sqlite3VdbeLoadString(p,iVar1,(char *)db);
                  sqlite3VdbeAddOp4(p,0xb1,iVar1,0,0,(char *)pVStack_68,-0xb);
                }
                renameReloadSchema(pParse,iDb_00,1);
                renameTestSchema(pParse,zDatabase,(uint)(iDb_00 == 1),"after rename",0);
              }
            }
          }
        }
      }
      else {
        sqlite3ErrorMsg(pParse,"there is already another table or index with this name: %s",db);
      }
    }
  }
  sqlite3SrcListDelete(db_00,pSrc);
  sqlite3DbFree(db_00,db);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterRenameTable(
  Parse *pParse,            /* Parser context. */
  SrcList *pSrc,            /* The table to rename. */
  Token *pName              /* The new table name. */
){
  int iDb;                  /* Database that contains the table */
  char *zDb;                /* Name of database iDb */
  Table *pTab;              /* Table being renamed */
  char *zName = 0;          /* NULL-terminated version of pName */
  sqlite3 *db = pParse->db; /* Database connection */
  int nTabName;             /* Number of UTF-8 characters in zTabName */
  const char *zTabName;     /* Original name of the table */
  Vdbe *v;
  VTable *pVTab = 0;        /* Non-zero if this is a v-tab with an xRename() */

  if( NEVER(db->mallocFailed) ) goto exit_rename_table;
  assert( pSrc->nSrc==1 );
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );

  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_rename_table;
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  zDb = db->aDb[iDb].zDbSName;

  /* Get a NULL terminated version of the new table name. */
  zName = sqlite3NameFromToken(db, pName);
  if( !zName ) goto exit_rename_table;

  /* Check that a table or index named 'zName' does not already exist
  ** in database iDb. If so, this is an error.
  */
  if( sqlite3FindTable(db, zName, zDb)
   || sqlite3FindIndex(db, zName, zDb)
   || sqlite3IsShadowTableOf(db, pTab, zName)
  ){
    sqlite3ErrorMsg(pParse,
        "there is already another table or index with this name: %s", zName);
    goto exit_rename_table;
  }

  /* Make sure it is not a system table being altered, or a reserved name
  ** that the table is being renamed to.
  */
  if( SQLITE_OK!=isAlterableTable(pParse, pTab) ){
    goto exit_rename_table;
  }
  if( SQLITE_OK!=sqlite3CheckObjectName(pParse,zName,"table",zName) ){
    goto exit_rename_table;
  }

#ifndef SQLITE_OMIT_VIEW
  if( IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "view %s may not be altered", pTab->zName);
    goto exit_rename_table;
  }
#endif

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, 0) ){
    goto exit_rename_table;
  }
#endif

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto exit_rename_table;
  }
  if( IsVirtual(pTab) ){
    pVTab = sqlite3GetVTable(db, pTab);
    if( pVTab->pVtab->pModule->xRename==0 ){
      pVTab = 0;
    }
  }
#endif

  /* Begin a transaction for database iDb. Then modify the schema cookie
  ** (since the ALTER TABLE modifies the schema). Call sqlite3MayAbort(),
  ** as the scalar functions (e.g. sqlite_rename_table()) invoked by the
  ** nested SQL may raise an exception.  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ){
    goto exit_rename_table;
  }
  sqlite3MayAbort(pParse);

  /* figure out how many UTF-8 characters are in zName */
  zTabName = pTab->zName;
  nTabName = sqlite3Utf8CharLen(zTabName, -1);

  /* Rewrite all CREATE TABLE, INDEX, TRIGGER or VIEW statements in
  ** the schema to use the new table name.  */
  sqlite3NestedParse(pParse,
      "UPDATE \"%w\"." LEGACY_SCHEMA_TABLE " SET "
      "sql = sqlite_rename_table(%Q, type, name, sql, %Q, %Q, %d) "
      "WHERE (type!='index' OR tbl_name=%Q COLLATE nocase)"
      "AND   name NOT LIKE 'sqliteX_%%' ESCAPE 'X'"
      , zDb, zDb, zTabName, zName, (iDb==1), zTabName
  );

  /* Update the tbl_name and name columns of the sqlite_schema table
  ** as required.  */
  sqlite3NestedParse(pParse,
      "UPDATE %Q." LEGACY_SCHEMA_TABLE " SET "
          "tbl_name = %Q, "
          "name = CASE "
            "WHEN type='table' THEN %Q "
            "WHEN name LIKE 'sqliteX_autoindex%%' ESCAPE 'X' "
            "     AND type='index' THEN "
             "'sqlite_autoindex_' || %Q || substr(name,%d+18) "
            "ELSE name END "
      "WHERE tbl_name=%Q COLLATE nocase AND "
          "(type='table' OR type='index' OR type='trigger');",
      zDb,
      zName, zName, zName,
      nTabName, zTabName
  );

#ifndef SQLITE_OMIT_AUTOINCREMENT
  /* If the sqlite_sequence table exists in this database, then update
  ** it with the new table name.
  */
  if( sqlite3FindTable(db, "sqlite_sequence", zDb) ){
    sqlite3NestedParse(pParse,
        "UPDATE \"%w\".sqlite_sequence set name = %Q WHERE name = %Q",
        zDb, zName, pTab->zName);
  }
#endif

  /* If the table being renamed is not itself part of the temp database,
  ** edit view and trigger definitions within the temp database
  ** as required.  */
  if( iDb!=1 ){
    sqlite3NestedParse(pParse,
        "UPDATE sqlite_temp_schema SET "
            "sql = sqlite_rename_table(%Q, type, name, sql, %Q, %Q, 1), "
            "tbl_name = "
              "CASE WHEN tbl_name=%Q COLLATE nocase AND "
              "  sqlite_rename_test(%Q, sql, type, name, 1, 'after rename', 0) "
              "THEN %Q ELSE tbl_name END "
            "WHERE type IN ('view', 'trigger')"
        , zDb, zTabName, zName, zTabName, zDb, zName);
  }

  /* If this is a virtual table, invoke the xRename() function if
  ** one is defined. The xRename() callback will modify the names
  ** of any resources used by the v-table implementation (including other
  ** SQLite tables) that are identified by the name of the virtual table.
  */
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( pVTab ){
    int i = ++pParse->nMem;
    sqlite3VdbeLoadString(v, i, zName);
    sqlite3VdbeAddOp4(v, OP_VRename, i, 0, 0,(const char*)pVTab, P4_VTAB);
  }
#endif

  renameReloadSchema(pParse, iDb, INITFLAG_AlterRename);
  renameTestSchema(pParse, zDb, iDb==1, "after rename", 0);

exit_rename_table:
  sqlite3SrcListDelete(db, pSrc);
  sqlite3DbFree(db, zName);
}